

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

int secp256k1_musig_nonce_gen_internal
              (secp256k1_context *ctx,secp256k1_musig_secnonce *secnonce,
              secp256k1_musig_pubnonce *pubnonce,uchar *input_nonce,uchar *seckey,
              secp256k1_pubkey *pubkey,uchar *msg32,secp256k1_musig_keyagg_cache *keyagg_cache,
              uchar *extra_input32)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uchar *r;
  bool bVar4;
  secp256k1_ge *psVar5;
  unsigned_long _zzq_args [6];
  uchar pk_ser [33];
  secp256k1_ge pk;
  uchar aggpk_ser [32];
  secp256k1_scalar k [2];
  secp256k1_gej nonce_ptj [2];
  secp256k1_ge nonce_pts [2];
  secp256k1_ge_storage local_318;
  size_t local_2d0;
  uchar local_2c8 [40];
  secp256k1_ge local_2a0;
  uchar local_248 [32];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [24];
  uint64_t uStack_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  secp256k1_ge local_e8;
  secp256k1_ge local_90;
  
  if (pubnonce == (secp256k1_musig_pubnonce *)0x0) {
    secp256k1_musig_nonce_gen_internal_cold_3();
  }
  else {
    memset(pubnonce,0,0x84);
    if (pubkey == (secp256k1_pubkey *)0x0) {
      secp256k1_musig_nonce_gen_internal_cold_2();
      return 0;
    }
    if ((ctx->ecmult_gen_ctx).built != 0) {
      if (seckey == (uchar *)0x0) {
        uVar3 = 1;
      }
      else {
        secp256k1_scalar_set_b32((secp256k1_scalar *)local_1e8,seckey,(int *)&local_2a0);
        uVar3 = (uint)(((local_1e8._8_8_ != 0 || uStack_1d0 != 0) ||
                       (local_1e8._0_8_ != 0 || local_1e8._16_8_ != 0)) &&
                      (int)local_2a0.x.n[0] == 0);
        local_1e8._0_16_ = (undefined1  [16])0x0;
        stack0xfffffffffffffe28 = (undefined1  [16])0x0;
      }
      if (keyagg_cache == (secp256k1_musig_keyagg_cache *)0x0) {
        r = (uchar *)0x0;
      }
      else {
        iVar2 = secp256k1_keyagg_cache_load
                          (ctx,(secp256k1_keyagg_cache_internal *)local_1e8,keyagg_cache);
        if (iVar2 == 0) {
          return 0;
        }
        r = local_248;
        secp256k1_fe_impl_get_b32(r,(secp256k1_fe *)local_1e8);
      }
      iVar2 = secp256k1_pubkey_load(ctx,&local_2a0,pubkey);
      if (iVar2 != 0) {
        secp256k1_eckey_pubkey_serialize(&local_2a0,local_2c8,&local_2d0,1);
        secp256k1_nonce_function_musig
                  ((secp256k1_scalar *)local_228,input_nonce,msg32,seckey,local_2c8,r,extra_input32)
        ;
        secp256k1_musig_secnonce_save(secnonce,(secp256k1_scalar *)local_228,&local_2a0);
        secp256k1_musig_secnonce_invalidate(ctx,secnonce,uVar3 ^ 1);
        secp256k1_ecmult_gen
                  (&ctx->ecmult_gen_ctx,(secp256k1_gej *)local_1e8,(secp256k1_scalar *)local_228);
        local_218 = (undefined1  [16])0x0;
        local_228 = (undefined1  [16])0x0;
        secp256k1_ecmult_gen
                  (&ctx->ecmult_gen_ctx,(secp256k1_gej *)local_168,(secp256k1_scalar *)local_208);
        local_1f8 = (undefined1  [16])0x0;
        local_208 = (undefined1  [16])0x0;
        secp256k1_ge_set_all_gej(&local_e8,(secp256k1_gej *)local_1e8,2);
        local_178 = (undefined1  [16])0x0;
        local_188 = (undefined1  [16])0x0;
        local_198 = (undefined1  [16])0x0;
        local_1a8 = (undefined1  [16])0x0;
        local_1b8 = (undefined1  [16])0x0;
        local_1c8 = (undefined1  [16])0x0;
        stack0xfffffffffffffe28 = (undefined1  [16])0x0;
        local_1e8._0_16_ = (undefined1  [16])0x0;
        local_f8 = (undefined1  [16])0x0;
        local_108 = (undefined1  [16])0x0;
        local_118 = (undefined1  [16])0x0;
        local_128 = (undefined1  [16])0x0;
        local_138 = (undefined1  [16])0x0;
        local_148 = (undefined1  [16])0x0;
        local_158 = (undefined1  [16])0x0;
        local_168 = (undefined1  [16])0x0;
        psVar5 = &local_e8;
        bVar1 = true;
        do {
          bVar4 = bVar1;
          if (ctx->declassify != 0) {
            local_318.x.n[0] = 0x4d430002;
            local_318.x.n[2] = 0x58;
            local_318.x.n[3] = 0;
            local_318.y.n[0] = 0;
            local_318.y.n[1] = 0;
            local_318.x.n[1] = (uint64_t)psVar5;
          }
          psVar5 = &local_90;
          bVar1 = false;
        } while (bVar4);
        pubnonce->data[0] = 0xf5;
        pubnonce->data[1] = 'z';
        pubnonce->data[2] = '=';
        pubnonce->data[3] = 0xa0;
        secp256k1_ge_to_storage(&local_318,&local_e8);
        *(uint64_t *)(pubnonce->data + 0x34) = local_318.y.n[2];
        *(uint64_t *)(pubnonce->data + 0x3c) = local_318.y.n[3];
        *(uint64_t *)(pubnonce->data + 0x24) = local_318.y.n[0];
        *(uint64_t *)(pubnonce->data + 0x2c) = local_318.y.n[1];
        *(uint64_t *)(pubnonce->data + 0x14) = local_318.x.n[2];
        *(uint64_t *)(pubnonce->data + 0x1c) = local_318.x.n[3];
        *(uint64_t *)(pubnonce->data + 4) = local_318.x.n[0];
        *(uint64_t *)(pubnonce->data + 0xc) = local_318.x.n[1];
        secp256k1_ge_to_storage(&local_318,&local_90);
        *(uint64_t *)(pubnonce->data + 0x74) = local_318.y.n[2];
        *(uint64_t *)(pubnonce->data + 0x7c) = local_318.y.n[3];
        *(uint64_t *)(pubnonce->data + 100) = local_318.y.n[0];
        *(uint64_t *)(pubnonce->data + 0x6c) = local_318.y.n[1];
        *(uint64_t *)(pubnonce->data + 0x54) = local_318.x.n[2];
        *(uint64_t *)(pubnonce->data + 0x5c) = local_318.x.n[3];
        *(uint64_t *)(pubnonce->data + 0x44) = local_318.x.n[0];
        *(uint64_t *)(pubnonce->data + 0x4c) = local_318.x.n[1];
        return uVar3;
      }
      return 0;
    }
    secp256k1_musig_nonce_gen_internal_cold_1();
  }
  return 0;
}

Assistant:

static int secp256k1_musig_nonce_gen_internal(const secp256k1_context* ctx, secp256k1_musig_secnonce *secnonce, secp256k1_musig_pubnonce *pubnonce, const unsigned char *input_nonce, const unsigned char *seckey, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache, const unsigned char *extra_input32) {
    secp256k1_scalar k[2];
    secp256k1_ge nonce_pts[2];
    secp256k1_gej nonce_ptj[2];
    int i;
    unsigned char pk_ser[33];
    size_t pk_ser_len = sizeof(pk_ser);
    unsigned char aggpk_ser[32];
    unsigned char *aggpk_ser_ptr = NULL;
    secp256k1_ge pk;
    int pk_serialize_success;
    int ret = 1;

    ARG_CHECK(pubnonce != NULL);
    memset(pubnonce, 0, sizeof(*pubnonce));
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));

    /* Check that the seckey is valid to be able to sign for it later. */
    if (seckey != NULL) {
        secp256k1_scalar sk;
        ret &= secp256k1_scalar_set_b32_seckey(&sk, seckey);
        secp256k1_scalar_clear(&sk);
    }

    if (keyagg_cache != NULL) {
        secp256k1_keyagg_cache_internal cache_i;
        if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
            return 0;
        }
        /* The loaded point cache_i.pk can not be the point at infinity. */
        secp256k1_fe_get_b32(aggpk_ser, &cache_i.pk.x);
        aggpk_ser_ptr = aggpk_ser;
    }
    if (!secp256k1_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }
    pk_serialize_success = secp256k1_eckey_pubkey_serialize(&pk, pk_ser, &pk_ser_len, 1);

#ifdef VERIFY
    /* A pubkey cannot be the point at infinity */
    VERIFY_CHECK(pk_serialize_success);
    VERIFY_CHECK(pk_ser_len == sizeof(pk_ser));
#else
    (void) pk_serialize_success;
#endif

    secp256k1_nonce_function_musig(k, input_nonce, msg32, seckey, pk_ser, aggpk_ser_ptr, extra_input32);
    VERIFY_CHECK(!secp256k1_scalar_is_zero(&k[0]));
    VERIFY_CHECK(!secp256k1_scalar_is_zero(&k[1]));
    secp256k1_musig_secnonce_save(secnonce, k, &pk);
    secp256k1_musig_secnonce_invalidate(ctx, secnonce, !ret);

    /* Compute pubnonce as two gejs */
    for (i = 0; i < 2; i++) {
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &nonce_ptj[i], &k[i]);
        secp256k1_scalar_clear(&k[i]);
    }

    /* Batch convert to two public ges */
    secp256k1_ge_set_all_gej(nonce_pts, nonce_ptj, 2);
    for (i = 0; i < 2; i++) {
        secp256k1_gej_clear(&nonce_ptj[i]);
    }

    for (i = 0; i < 2; i++) {
        secp256k1_declassify(ctx, &nonce_pts[i], sizeof(nonce_pts[i]));
    }
    /* None of the nonce_pts will be infinity because k != 0 with overwhelming
     * probability */
    secp256k1_musig_pubnonce_save(pubnonce, nonce_pts);
    return ret;
}